

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O2

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
::settle(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
         *this)

{
  iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *piVar1;
  
  remove_empty_ranges(this);
  piVar1 = (this->m_begin)._M_current;
  if ((ulong)((long)(this->m_end)._M_current - (long)piVar1 >> 4) < this->m_min_items) {
    (this->m_end)._M_current = piVar1;
    return;
  }
  maintain_invariant(this);
  next_semiintersection(this);
  return;
}

Assistant:

void settle ()
        {
            remove_empty_ranges();
            if (range_count() >= m_min_items)
            {
                maintain_invariant();
                next_semiintersection();
            }
            else
            {
                scroll_to_end();
            }
        }